

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cc
# Opt level: O3

void __thiscall CpuProfiler::CpuProfiler(CpuProfiler *this)

{
  bool bVar1;
  __uid_t _Var2;
  __uid_t _Var3;
  char *pcVar4;
  long lVar5;
  __sighandler_t p_Var6;
  int *piVar7;
  char local_1028 [8];
  char fname [4096];
  
  (this->lock_).lockword_.super___atomic_base<int>._M_i = 0;
  ProfileData::ProfileData(&this->collector_);
  this->prof_handler_token_ = (ProfileHandlerToken *)0x0;
  pcVar4 = getenv("CPUPROFILE");
  if (pcVar4 != (char *)0x0) {
    _Var2 = getuid();
    _Var3 = geteuid();
    if (_Var2 == _Var3) {
      pcVar4 = getenv("CPUPROFILESIGNAL");
      if (pcVar4 == (char *)0x0) {
        bVar1 = GetUniquePathFromEnv("CPUPROFILE",local_1028);
        if (bVar1) {
          bVar1 = Start(this,local_1028,(ProfilerOptions *)0x0);
          if (!bVar1) {
            piVar7 = __errno_location();
            pcVar4 = strerror(*piVar7);
            RAW_LOG(-4,"Can\'t turn on cpu profiling for \'%s\': %s\n",local_1028,pcVar4);
          }
        }
      }
      else {
        lVar5 = strtol(pcVar4,(char **)0x0,10);
        if (lVar5 - 1U < 0x40) {
          p_Var6 = signal((int)lVar5,CpuProfilerSwitch);
          pcVar4 = "Signal %d already in use\n";
          if (p_Var6 == (__sighandler_t)0x0) {
            pcVar4 = "Using signal %d as cpu profiling switch";
          }
          RAW_LOG(-(uint)(p_Var6 == (__sighandler_t)0x0) | 0xfffffffc,pcVar4,lVar5);
        }
        else {
          RAW_LOG(-4,"Signal number %s is invalid\n",pcVar4);
        }
      }
    }
  }
  return;
}

Assistant:

CpuProfiler::CpuProfiler()
    : prof_handler_token_(nullptr) {
  if (getenv("CPUPROFILE") == nullptr) {
    return;
  }

  // We don't enable profiling if setuid -- it's a security risk
#ifdef HAVE_GETEUID
  if (getuid() != geteuid()) {
    return;
  }
#endif

  char *signal_number_str = getenv("CPUPROFILESIGNAL");
  if (signal_number_str != nullptr) {
    long int signal_number = strtol(signal_number_str, nullptr, 10);
    if (signal_number >= 1 && signal_number <= 64) {
      intptr_t old_signal_handler = reinterpret_cast<intptr_t>(signal(signal_number, CpuProfilerSwitch));
      if (old_signal_handler == 0) {
        RAW_LOG(INFO,"Using signal %d as cpu profiling switch", signal_number);
      } else {
        RAW_LOG(FATAL, "Signal %d already in use\n", signal_number);
      }
    } else {
      RAW_LOG(FATAL, "Signal number %s is invalid\n", signal_number_str);
    }
  } else {
    char fname[PATH_MAX];
    if (!GetUniquePathFromEnv("CPUPROFILE", fname)) {
      return;
    }

    if (!Start(fname, nullptr)) {
      RAW_LOG(FATAL, "Can't turn on cpu profiling for '%s': %s\n",
              fname, strerror(errno));
    }
  }
}